

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int ParseExpLogAnd(char **p,aint *nval)

{
  int iVar1;
  bool local_29;
  int local_28;
  int local_24;
  aint right;
  aint left;
  aint *nval_local;
  char **p_local;
  
  _right = nval;
  nval_local = (aint *)p;
  iVar1 = ParseExpBitOr(p,&local_24);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    while (iVar1 = need((char **)nval_local,"&&"), iVar1 != 0) {
      iVar1 = ParseExpBitOr((char **)nval_local,&local_28);
      if (iVar1 == 0) {
        return 0;
      }
      local_29 = local_24 != 0 && local_28 != 0;
      local_24 = -(uint)local_29;
    }
    *_right = local_24;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

static int ParseExpLogAnd(char*& p, aint& nval) {
	aint left, right;
	if (!ParseExpBitOr(p, left)) return 0;
	while (need(p, "&&")) {
		if (!ParseExpBitOr(p, right)) return 0;
		left = -(left && right);
	}
	nval = left;
	return 1;
}